

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfd_psbt.cpp
# Opt level: O3

void __thiscall
cfd::Psbt::CollectInputUtxo(Psbt *this,vector<cfd::UtxoData,_std::allocator<cfd::UtxoData>_> *utxos)

{
  pointer pKVar1;
  pointer pKVar2;
  bool bVar3;
  uint32_t uVar4;
  KeyData *this_00;
  pointer pUVar5;
  pointer utxo;
  vector<cfd::core::KeyData,_std::allocator<cfd::core::KeyData>_> key_list;
  OutPoint outpoint;
  Script redeem_script;
  TxOut txout;
  vector<cfd::core::KeyData,_std::allocator<cfd::core::KeyData>_> local_158;
  _func_int **local_140;
  pointer local_138;
  OutPoint local_130;
  Script local_108;
  undefined1 local_d0 [80];
  code *local_80 [3];
  Script local_68;
  
  cfd::core::OutPoint::OutPoint(&local_130);
  cfd::core::TxOut::TxOut((TxOut *)local_80);
  local_158.super__Vector_base<cfd::core::KeyData,_std::allocator<cfd::core::KeyData>_>._M_impl.
  super__Vector_impl_data._M_start = (KeyData *)0x0;
  local_158.super__Vector_base<cfd::core::KeyData,_std::allocator<cfd::core::KeyData>_>._M_impl.
  super__Vector_impl_data._M_finish = (KeyData *)0x0;
  local_158.super__Vector_base<cfd::core::KeyData,_std::allocator<cfd::core::KeyData>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  cfd::core::Script::Script(&local_108);
  utxo = (utxos->super__Vector_base<cfd::UtxoData,_std::allocator<cfd::UtxoData>_>)._M_impl.
         super__Vector_impl_data._M_start;
  pUVar5 = (utxos->super__Vector_base<cfd::UtxoData,_std::allocator<cfd::UtxoData>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  if (utxo != pUVar5) {
    local_140 = (_func_int **)&PTR__AbstractTxOutReference_002b1160;
    local_138 = pUVar5;
    do {
      pKVar2 = local_158.super__Vector_base<cfd::core::KeyData,_std::allocator<cfd::core::KeyData>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      pKVar1 = local_158.super__Vector_base<cfd::core::KeyData,_std::allocator<cfd::core::KeyData>_>
               ._M_impl.super__Vector_impl_data._M_start;
      if ((utxo->descriptor)._M_string_length != 0) {
        this_00 = local_158.
                  super__Vector_base<cfd::core::KeyData,_std::allocator<cfd::core::KeyData>_>.
                  _M_impl.super__Vector_impl_data._M_start;
        if (local_158.super__Vector_base<cfd::core::KeyData,_std::allocator<cfd::core::KeyData>_>.
            _M_impl.super__Vector_impl_data._M_finish !=
            local_158.super__Vector_base<cfd::core::KeyData,_std::allocator<cfd::core::KeyData>_>.
            _M_impl.super__Vector_impl_data._M_start) {
          do {
            core::KeyData::~KeyData(this_00);
            this_00 = this_00 + 1;
          } while (this_00 != pKVar2);
          local_158.super__Vector_base<cfd::core::KeyData,_std::allocator<cfd::core::KeyData>_>.
          _M_impl.super__Vector_impl_data._M_finish = pKVar1;
          pUVar5 = local_138;
        }
        bVar3 = ConvertFromUtxoData(utxo,&local_130,(TxOut *)local_80,&local_158,&local_108,true,
                                    (NetType *)0x0);
        if (bVar3) {
          cfd::core::TxOutReference::TxOutReference((TxOutReference *)local_d0,(TxOut *)local_80);
          uVar4 = GetTxInIndex(this,&local_130);
          cfd::core::Psbt::SetTxInUtxo
                    ((uint)this,(TxOutReference *)(ulong)uVar4,(Script *)local_d0,
                     (vector *)&local_108);
          local_d0._0_8_ = local_140;
          core::Script::~Script((Script *)(local_d0 + 0x18));
        }
      }
      utxo = utxo + 1;
    } while (utxo != pUVar5);
  }
  core::Script::~Script(&local_108);
  std::vector<cfd::core::KeyData,_std::allocator<cfd::core::KeyData>_>::~vector(&local_158);
  local_80[0] = cfd::core::ExtPrivkey::IsValid;
  core::Script::~Script(&local_68);
  local_130.txid_._vptr_Txid = (_func_int **)&PTR__Txid_002b0f00;
  if (local_130.txid_.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_130.txid_.data_.data_.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void Psbt::CollectInputUtxo(const std::vector<UtxoData>& utxos) {
  OutPoint outpoint;
  TxOut txout;
  std::vector<KeyData> key_list;
  Script redeem_script;
  for (const auto& utxo : utxos) {
    if (utxo.descriptor.empty()) continue;
    key_list.clear();
    bool is_witness = ConvertFromUtxoData(
        utxo, &outpoint, &txout, &key_list, &redeem_script, true);
    if (is_witness) {
      SetTxInUtxo(outpoint, TxOutReference(txout), redeem_script, key_list);
    }
  }
}